

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
chrono::utils::ChParserOpenSim::strToSTLVector<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ChParserOpenSim *this,char *string)

{
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  beg;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  istringstream buf;
  allocator_type local_261;
  undefined1 local_260 [16];
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  bool local_238;
  istream_type *local_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  undefined1 local_208;
  undefined1 local_200 [8];
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  bool local_1d8;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  bool local_1a8;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  std::__cxx11::string::string((string *)local_260,(char *)this,(allocator *)&local_230);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)local_260,_S_in);
  if ((istream_type *)local_260._0_8_ != (istream_type *)&local_250) {
    operator_delete((void *)local_260._0_8_,local_250 + 1);
  }
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_260,(istream_type *)local_1a0);
  local_230 = (istream_type *)0x0;
  local_220 = 0;
  local_218 = 0;
  local_208 = 0;
  local_200 = (undefined1  [8])local_260._0_8_;
  local_228 = &local_218;
  local_1f8._M_p = (pointer)&local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,local_260._8_8_,(char *)(local_260._8_8_ + local_250));
  local_1d0 = (undefined1  [8])local_230;
  local_1d8 = local_238;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,local_228,local_228 + local_220);
  local_1a8 = (bool)local_208;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_200,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_1d0,&local_261);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._8_8_ != &local_248) {
    operator_delete((void *)local_260._8_8_,local_248._M_allocated_capacity + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static inline std::vector<T> strToSTLVector(const char* string) {
        std::istringstream buf(string);
        std::istream_iterator<T> beg(buf), end;
        return std::vector<T>(beg, end);
    }